

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Statement> __thiscall Parser::whileStatement(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Statement> pVar2;
  ptr<StatementBlock> statBlock;
  ptr<Expression> condition;
  undefined1 auStack_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  shared_ptr<Expression> local_28;
  
  consume(in_RSI);
  expression((Parser *)(auStack_48 + 0x10));
  in_RSI->functionCounter = in_RSI->functionCounter + 1;
  statementBlock((Parser *)auStack_48);
  in_RSI->functionCounter = in_RSI->functionCounter + -1;
  std::make_shared<WhileStatement,std::shared_ptr<Expression>&,std::shared_ptr<StatementBlock>&>
            (&local_28,(shared_ptr<StatementBlock> *)(auStack_48 + 0x10));
  _Var1._M_pi = local_28.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_28.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filepath)._M_dataplus._M_p =
       (pointer)local_28.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->filepath)._M_string_length = (size_type)_Var1._M_pi;
  local_28.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::whileStatement() {
    consume();
    ptr<Expression> condition = expression();

    functionCounter++;
    ptr<StatementBlock> statBlock = statementBlock();
    functionCounter--;

    return make<WhileStatement>(condition, statBlock);
}